

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::ShiftRightU(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  uint32 uVar1;
  uint32 uVar2;
  Var pvVar3;
  
  uVar1 = ToUInt32(aLeft);
  uVar2 = ToUInt32(aRight);
  pvVar3 = JavascriptNumber::ToVar(uVar1 >> ((byte)uVar2 & 0x1f),scriptContext);
  return pvVar3;
}

Assistant:

Var TaggedInt::ShiftRightU(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        //
        // If aLeft was an Int31 coming in, then the result must always be an Int31 going out because
        // shifting right only makes value smaller. Therefore, we may call ToVarUnchecked()
        // directly.
        //

        uint32 uValue   = ToUInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return JavascriptNumber::ToVar(uValue >> (nShift & 0x1F), scriptContext);
    }